

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O0

btree_result
btree_init_from_bid(btree *btree,void *blk_handle,btree_blk_ops *blk_ops,btree_kv_ops *kv_ops,
                   uint32_t nodesize,bid_t root_bid)

{
  voidref addr_00;
  bnode *pbVar1;
  btree_kv_ops *in_RCX;
  btree_blk_ops *in_RDX;
  void *in_RSI;
  btree *in_RDI;
  uint32_t in_R8D;
  bid_t in_R9;
  bnode *root;
  void *addr;
  
  in_RDI->blk_ops = in_RDX;
  in_RDI->blk_handle = in_RSI;
  in_RDI->kv_ops = in_RCX;
  in_RDI->blksize = in_R8D;
  in_RDI->root_bid = in_R9;
  addr_00 = (*in_RDI->blk_ops->blk_read)(in_RDI->blk_handle,in_RDI->root_bid);
  pbVar1 = _fetch_bnode(in_RDI,addr_00,0);
  in_RDI->root_flag = pbVar1->flag;
  in_RDI->height = pbVar1->level;
  in_RDI->ksize = (uint8_t)(pbVar1->kvsize >> 8);
  in_RDI->vsize = (uint8_t)pbVar1->kvsize;
  return BTREE_RESULT_SUCCESS;
}

Assistant:

btree_result btree_init_from_bid(struct btree *btree, void *blk_handle,
                                 struct btree_blk_ops *blk_ops,
                                 struct btree_kv_ops *kv_ops,
                                 uint32_t nodesize, bid_t root_bid)
{
    void *addr;
    struct bnode *root;

    btree->blk_ops = blk_ops;
    btree->blk_handle = blk_handle;
    btree->kv_ops = kv_ops;
    btree->blksize = nodesize;
    btree->root_bid = root_bid;

    addr = btree->blk_ops->blk_read(btree->blk_handle, btree->root_bid);
    root = _fetch_bnode(btree, addr, 0);

    btree->root_flag = root->flag;
    btree->height = root->level;
    _get_kvsize(root->kvsize, btree->ksize, btree->vsize);

    return BTREE_RESULT_SUCCESS;
}